

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char local_68;
  char local_67;
  char local_66;
  char local_65;
  char local_64;
  undefined1 local_63;
  char local_62;
  char local_61;
  char zBuf [16];
  undefined1 local_50 [4];
  int Y;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  x._40_8_ = argv;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_50);
  if (iVar1 == 0) {
    computeYMD((DateTime *)local_50);
    zBuf[0xc] = (undefined1)x.iJD;
    zBuf[0xd] = x.iJD._1_1_;
    zBuf[0xe] = x.iJD._2_1_;
    zBuf[0xf] = x.iJD._3_1_;
    if ((int)x.iJD < 0) {
      zBuf._12_4_ = -(int)x.iJD;
    }
    local_67 = (char)((long)((ulong)(uint)((int)((long)(int)zBuf._12_4_ / 1000) >> 0x1f) << 0x20 |
                            (long)(int)zBuf._12_4_ / 1000 & 0xffffffffU) % 10) + '0';
    local_66 = (char)((long)((ulong)(uint)((int)((long)(int)zBuf._12_4_ / 100) >> 0x1f) << 0x20 |
                            (long)(int)zBuf._12_4_ / 100 & 0xffffffffU) % 10) + '0';
    local_65 = (char)((long)((ulong)(uint)((int)((long)(int)zBuf._12_4_ / 10) >> 0x1f) << 0x20 |
                            (long)(int)zBuf._12_4_ / 10 & 0xffffffffU) % 10) + '0';
    local_64 = (char)((int)zBuf._12_4_ % 10) + '0';
    local_63 = 0x2d;
    local_62 = (char)((long)((ulong)(uint)((int)((long)x.iJD._4_4_ / 10) >> 0x1f) << 0x20 |
                            (long)x.iJD._4_4_ / 10 & 0xffffffffU) % 10) + '0';
    local_61 = (char)(x.iJD._4_4_ % 10) + '0';
    zBuf[0] = '-';
    zBuf[1] = (char)((long)((ulong)(uint)((int)((long)x.Y / 10) >> 0x1f) << 0x20 |
                           (long)x.Y / 10 & 0xffffffffU) % 10) + '0';
    zBuf[2] = (char)(x.Y % 10) + '0';
    zBuf[3] = '\0';
    if ((int)x.iJD < 0) {
      local_68 = '-';
      sqlite3_result_text(context,&local_68,0xb,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(context,&local_67,10,(_func_void_void_ptr *)0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}